

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O0

void __thiscall OpenMD::DirectionalAtom::rotateBy(DirectionalAtom *this,RotMat3x3d *m)

{
  long *in_RDI;
  SquareMatrix3<double> *in_stack_ffffffffffffff70;
  SnapshotManager *in_stack_ffffffffffffff78;
  undefined1 local_58 [88];
  
  StuntDouble::getA((StuntDouble *)&stack0xffffffffffffff60);
  OpenMD::operator*((SquareMatrix3<double> *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  (**(code **)(*in_RDI + 0x18))(in_RDI,local_58);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x321813);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x32181d);
  return;
}

Assistant:

void DirectionalAtom::rotateBy(const RotMat3x3d& m) { setA(m * getA()); }